

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O1

int Gia_IffObjCount(Gia_Man_t *pGia,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  Gia_ManIncrementTravId(pGia);
  if (-1 < iObj) {
    pVVar2 = pGia->vMapping;
    lVar5 = 0;
    iVar4 = 0;
    while (iObj < pVVar2->nSize) {
      piVar3 = pVVar2->pArray;
      lVar6 = (long)piVar3[(uint)iObj];
      if ((lVar6 < 0) || (pVVar2->nSize <= piVar3[(uint)iObj])) break;
      if (piVar3[lVar6] <= lVar5) {
        if (iFaninSkip2 < 0) goto LAB_006bdbd1;
        lVar5 = 0;
        goto LAB_006bdb68;
      }
      iVar1 = piVar3[lVar6 + lVar5 + 1];
      if (iVar1 != iFaninSkip3 && iVar1 != iFaninSkip2) {
        if (pGia->nTravIdsAlloc <= iVar1) goto LAB_006bdc5f;
        if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
          pGia->pTravIds[iVar1] = pGia->nTravIds;
          iVar4 = iVar4 + 1;
        }
      }
      lVar5 = lVar5 + 1;
      if (iObj < 0) break;
    }
  }
  goto LAB_006bdc35;
LAB_006bdb68:
  if (pVVar2->nSize <= iFaninSkip2) goto LAB_006bdc35;
  lVar6 = (long)piVar3[(uint)iFaninSkip2];
  if ((lVar6 < 0) || (pVVar2->nSize <= piVar3[(uint)iFaninSkip2])) goto LAB_006bdc35;
  if (piVar3[lVar6] <= lVar5) goto LAB_006bdbd1;
  iVar1 = piVar3[lVar6 + lVar5 + 1];
  if (iVar1 != iFaninSkip3) {
    if (pGia->nTravIdsAlloc <= iVar1) goto LAB_006bdc5f;
    if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
      pGia->pTravIds[iVar1] = pGia->nTravIds;
      iVar4 = iVar4 + 1;
    }
  }
  lVar5 = lVar5 + 1;
  if (iFaninSkip2 < 0) goto LAB_006bdc35;
  goto LAB_006bdb68;
LAB_006bdbd1:
  if (iFaninSkip3 < 0) {
    return iVar4;
  }
  lVar5 = 0;
  while (iFaninSkip3 < pVVar2->nSize) {
    lVar6 = (long)piVar3[(uint)iFaninSkip3];
    if ((lVar6 < 0) || (pVVar2->nSize <= piVar3[(uint)iFaninSkip3])) break;
    if (piVar3[lVar6] <= lVar5) {
      return iVar4;
    }
    iVar1 = piVar3[lVar6 + lVar5 + 1];
    if (iVar1 != iFaninSkip2) {
      if (pGia->nTravIdsAlloc <= iVar1) {
LAB_006bdc5f:
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x22c,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (pGia->pTravIds[iVar1] != pGia->nTravIds) {
        pGia->pTravIds[iVar1] = pGia->nTravIds;
        iVar4 = iVar4 + 1;
      }
    }
    lVar5 = lVar5 + 1;
    if (iFaninSkip3 < 0) break;
  }
LAB_006bdc35:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_IffObjCount( Gia_Man_t * pGia, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin, Count = 0;
    Gia_ManIncrementTravId( pGia );
    Gia_LutForEachFanin( pGia, iObj, iFanin, i )
    {
        if ( iFanin == iFaninSkip2 || iFanin == iFaninSkip3 )
            continue;
        if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
            continue;
        Gia_ObjSetTravIdCurrentId( pGia, iFanin );
        Count++;
    }
    if ( iFaninSkip2 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip2, iFanin, i )
        {
            if ( iFanin == iFaninSkip3 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    if ( iFaninSkip3 >= 0 )
    {
        Gia_LutForEachFanin( pGia, iFaninSkip3, iFanin, i )
        {
            if ( iFanin == iFaninSkip2 )
                continue;
            if ( Gia_ObjIsTravIdCurrentId( pGia, iFanin ) )
                continue;
            Gia_ObjSetTravIdCurrentId( pGia, iFanin );
            Count++;
        }
    }
    return Count;
}